

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

TxoutType Solver(CScript *scriptPubKey,
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *vSolutionsRet)

{
  uint uVar1;
  opcodetype opcode_00;
  bool bVar2;
  uint uVar3;
  uchar *puVar4;
  _Optional_base<int,_true,_true> _Var5;
  optional<int> oVar6;
  CScript *pCVar7;
  TxoutType TVar8;
  CScript *pCVar9;
  long in_FS_OFFSET;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  keys;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  int witnessversion;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  const_iterator it;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashBytes;
  opcodetype opcode;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::clear(vSolutionsRet);
  bVar2 = CScript::IsPayToScriptHash(scriptPubKey);
  if (bVar2) {
    if (0x1c < (scriptPubKey->super_CScriptBase)._size) {
      scriptPubKey = (CScript *)(scriptPubKey->super_CScriptBase)._union.indirect_contents.indirect;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&hashBytes,
               (uchar *)((long)&(scriptPubKey->super_CScriptBase)._union + 2),
               (uchar *)((long)&(scriptPubKey->super_CScriptBase)._union + 0x16),
               (allocator_type *)&local_50);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back(vSolutionsRet,&hashBytes);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    TVar8 = SCRIPTHASH;
    goto LAB_00afd41b;
  }
  witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = CScript::IsWitnessProgram(scriptPubKey,&witnessversion,&witnessprogram);
  if (bVar2) {
    if (witnessversion == 1) {
      if ((long)witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x20) {
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)vSolutionsRet,&witnessprogram);
        TVar8 = WITNESS_V1_TAPROOT;
        goto LAB_00afd411;
      }
    }
    else if (witnessversion == 0) {
      if ((long)witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x20) {
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)vSolutionsRet,&witnessprogram);
        TVar8 = WITNESS_V0_SCRIPTHASH;
      }
      else {
        if ((long)witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0x14) goto LAB_00afd089;
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)vSolutionsRet,&witnessprogram);
        TVar8 = WITNESS_V0_KEYHASH;
      }
      goto LAB_00afd411;
    }
LAB_00afd089:
    bVar2 = CScript::IsPayToAnchor(scriptPubKey);
    if (bVar2) {
      TVar8 = ANCHOR;
    }
    else if (witnessversion == 0) {
      TVar8 = NONSTANDARD;
    }
    else {
      local_50._M_impl.super__Vector_impl_data._M_start._0_1_ = SUB41(witnessversion,0);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_50;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&hashBytes,__l,(allocator_type *)&local_98);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)vSolutionsRet,&hashBytes);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)vSolutionsRet,&witnessprogram);
      TVar8 = WITNESS_UNKNOWN;
    }
  }
  else {
    uVar3 = (scriptPubKey->super_CScriptBase)._size;
    uVar1 = uVar3 - 0x1d;
    if (uVar3 < 0x1d) {
      uVar1 = uVar3;
    }
    pCVar7 = *(CScript **)&(scriptPubKey->super_CScriptBase)._union;
    if (uVar1 != 0) {
      pCVar9 = pCVar7;
      if (uVar3 < 0x1d) {
        pCVar9 = scriptPubKey;
      }
      if ((pCVar9->super_CScriptBase)._union.direct[0] == 'j') {
        bVar2 = CScript::IsPushOnly(scriptPubKey,
                                    (uchar *)((long)&(pCVar9->super_CScriptBase)._union + 1));
        if (bVar2) {
          TVar8 = NULL_DATA;
          goto LAB_00afd411;
        }
        uVar3 = (scriptPubKey->super_CScriptBase)._size;
        pCVar7 = *(CScript **)&(scriptPubKey->super_CScriptBase)._union;
      }
    }
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (uVar3 == 0x60) {
      if ((pCVar7->super_CScriptBase)._union.direct[0] != 'A') {
        uVar3 = 0x60;
        goto LAB_00afd1ea;
      }
      puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::back
                         (&scriptPubKey->super_CScriptBase);
      uVar3 = (scriptPubKey->super_CScriptBase)._size;
      pCVar7 = *(CScript **)&(scriptPubKey->super_CScriptBase)._union;
      if (*puVar4 != 0xac) goto LAB_00afd155;
      if (uVar3 < 0x1d) {
        pCVar7 = scriptPubKey;
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&hashBytes,
                 (uchar *)((long)&(pCVar7->super_CScriptBase)._union + 1),
                 (uchar *)((long)&pCVar7[2].super_CScriptBase._union + 2),
                 (allocator_type *)&local_50);
LAB_00afd19f:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&data,&hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
      ;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      bVar2 = CPubKey::ValidSize(&data);
      if (!bVar2) {
        uVar3 = (scriptPubKey->super_CScriptBase)._size;
        pCVar7 = *(CScript **)&(scriptPubKey->super_CScriptBase)._union;
        goto LAB_00afd1ea;
      }
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)vSolutionsRet,&data);
      TVar8 = PUBKEY;
    }
    else {
LAB_00afd155:
      if (uVar3 == 0x40) {
        if ((pCVar7->super_CScriptBase)._union.direct[0] == '!') {
          puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::back
                             (&scriptPubKey->super_CScriptBase);
          uVar3 = (scriptPubKey->super_CScriptBase)._size;
          pCVar7 = *(CScript **)&(scriptPubKey->super_CScriptBase)._union;
          if (*puVar4 == 0xac) {
            if (uVar3 < 0x1d) {
              pCVar7 = scriptPubKey;
            }
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&hashBytes,
                       (uchar *)((long)&(pCVar7->super_CScriptBase)._union + 1),
                       (uchar *)((long)&pCVar7[1].super_CScriptBase._union + 2),
                       (allocator_type *)&local_50);
            goto LAB_00afd19f;
          }
        }
        else {
          uVar3 = 0x40;
        }
      }
LAB_00afd1ea:
      uVar1 = uVar3 - 0x1d;
      if (uVar3 < 0x1d) {
        pCVar7 = scriptPubKey;
        uVar1 = uVar3;
      }
      if (((((uVar1 == 0x19) && ((pCVar7->super_CScriptBase)._union.direct[0] == 'v')) &&
           ((pCVar7->super_CScriptBase)._union.direct[1] == -0x57)) &&
          (((pCVar7->super_CScriptBase)._union.direct[2] == '\x14' &&
           ((pCVar7->super_CScriptBase)._union.direct[0x17] == -0x78)))) &&
         ((pCVar7->super_CScriptBase)._union.direct[0x18] == -0x54)) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&hashBytes,
                   (uchar *)((long)&(pCVar7->super_CScriptBase)._union + 3),
                   (uchar *)((long)&(pCVar7->super_CScriptBase)._union + 0x17),
                   (allocator_type *)&local_50);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (&data,&hashBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::
        vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
        ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    *)vSolutionsRet,&data);
        TVar8 = PUBKEYHASH;
      }
      else {
        keys.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        keys.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        keys.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        it.ptr = (uchar *)pCVar7;
        if (((uVar1 == 0) ||
            (puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::back
                                (&scriptPubKey->super_CScriptBase), *puVar4 != 0xae)) ||
           (bVar2 = CScript::GetOp(scriptPubKey,&it,&opcode,&hashBytes), opcode_00 = opcode, !bVar2)
           ) {
LAB_00afd322:
          bVar2 = false;
          _Var5._M_payload.super__Optional_payload_base<int> =
               (_Optional_payload<int,_true,_true,_true>)
               (_Optional_payload<int,_true,_true,_true>)scriptPubKey;
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,&hashBytes);
          _Var5._M_payload.super__Optional_payload_base<int> =
               (_Optional_payload<int,_true,_true,_true>)
               GetScriptNumber(opcode_00,(valtype *)&local_50,1,0x14);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50)
          ;
          if (((ulong)_Var5._M_payload.super__Optional_payload_base<int> >> 0x20 & 1) == 0)
          goto LAB_00afd322;
          while ((bVar2 = CScript::GetOp(scriptPubKey,&it,&opcode,&hashBytes), bVar2 &&
                 (bVar2 = CPubKey::ValidSize(&hashBytes), bVar2))) {
            std::
            vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        *)&keys,&hashBytes);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98,&hashBytes);
          oVar6 = GetScriptNumber(opcode,(valtype *)&local_98,
                                  _Var5._M_payload.super__Optional_payload_base<int>._M_payload,0x14
                                 );
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98)
          ;
          if ((((ulong)oVar6.super__Optional_base<int,_true,_true>._M_payload.
                       super__Optional_payload_base<int> & 0x100000000) == 0) ||
             (((long)keys.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)keys.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18 !=
              (long)oVar6.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>._M_payload)) {
            bVar2 = false;
          }
          else {
            uVar3 = (scriptPubKey->super_CScriptBase)._size;
            uVar1 = uVar3 - 0x1d;
            if (uVar3 < 0x1d) {
              uVar1 = uVar3;
            }
            if (uVar3 >= 0x1d) {
              scriptPubKey = (CScript *)
                             (scriptPubKey->super_CScriptBase)._union.indirect_contents.indirect;
            }
            bVar2 = it.ptr + 1 ==
                    (uchar *)((scriptPubKey->super_CScriptBase)._union.direct + (int)uVar1);
          }
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        if (bVar2) {
          local_50._M_impl.super__Vector_impl_data._M_start._0_1_ =
               _Var5._M_payload.super__Optional_payload_base<int>._M_payload._0_1_;
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&local_50;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&hashBytes,__l_00,(allocator_type *)&local_98);
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      *)vSolutionsRet,&hashBytes);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,void>
                    ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      *)vSolutionsRet,
                     (vSolutionsRet->
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,
                     (__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      )keys.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      )keys.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          local_50._M_impl.super__Vector_impl_data._M_start._0_1_ =
               SUB81(((long)keys.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)keys.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18,0);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&local_50;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&hashBytes,__l_01,(allocator_type *)&local_98);
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      *)vSolutionsRet,&hashBytes);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          TVar8 = MULTISIG;
        }
        else {
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::clear(vSolutionsRet);
          TVar8 = NONSTANDARD;
        }
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector(&keys);
      }
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
LAB_00afd411:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_00afd41b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return TVar8;
  }
  __stack_chk_fail();
}

Assistant:

TxoutType Solver(const CScript& scriptPubKey, std::vector<std::vector<unsigned char>>& vSolutionsRet)
{
    vSolutionsRet.clear();

    // Shortcut for pay-to-script-hash, which are more constrained than the other types:
    // it is always OP_HASH160 20 [20 byte hash] OP_EQUAL
    if (scriptPubKey.IsPayToScriptHash())
    {
        std::vector<unsigned char> hashBytes(scriptPubKey.begin()+2, scriptPubKey.begin()+22);
        vSolutionsRet.push_back(hashBytes);
        return TxoutType::SCRIPTHASH;
    }

    int witnessversion;
    std::vector<unsigned char> witnessprogram;
    if (scriptPubKey.IsWitnessProgram(witnessversion, witnessprogram)) {
        if (witnessversion == 0 && witnessprogram.size() == WITNESS_V0_KEYHASH_SIZE) {
            vSolutionsRet.push_back(std::move(witnessprogram));
            return TxoutType::WITNESS_V0_KEYHASH;
        }
        if (witnessversion == 0 && witnessprogram.size() == WITNESS_V0_SCRIPTHASH_SIZE) {
            vSolutionsRet.push_back(std::move(witnessprogram));
            return TxoutType::WITNESS_V0_SCRIPTHASH;
        }
        if (witnessversion == 1 && witnessprogram.size() == WITNESS_V1_TAPROOT_SIZE) {
            vSolutionsRet.push_back(std::move(witnessprogram));
            return TxoutType::WITNESS_V1_TAPROOT;
        }
        if (scriptPubKey.IsPayToAnchor()) {
            return TxoutType::ANCHOR;
        }
        if (witnessversion != 0) {
            vSolutionsRet.push_back(std::vector<unsigned char>{(unsigned char)witnessversion});
            vSolutionsRet.push_back(std::move(witnessprogram));
            return TxoutType::WITNESS_UNKNOWN;
        }
        return TxoutType::NONSTANDARD;
    }

    // Provably prunable, data-carrying output
    //
    // So long as script passes the IsUnspendable() test and all but the first
    // byte passes the IsPushOnly() test we don't care what exactly is in the
    // script.
    if (scriptPubKey.size() >= 1 && scriptPubKey[0] == OP_RETURN && scriptPubKey.IsPushOnly(scriptPubKey.begin()+1)) {
        return TxoutType::NULL_DATA;
    }

    std::vector<unsigned char> data;
    if (MatchPayToPubkey(scriptPubKey, data)) {
        vSolutionsRet.push_back(std::move(data));
        return TxoutType::PUBKEY;
    }

    if (MatchPayToPubkeyHash(scriptPubKey, data)) {
        vSolutionsRet.push_back(std::move(data));
        return TxoutType::PUBKEYHASH;
    }

    int required;
    std::vector<std::vector<unsigned char>> keys;
    if (MatchMultisig(scriptPubKey, required, keys)) {
        vSolutionsRet.push_back({static_cast<unsigned char>(required)}); // safe as required is in range 1..20
        vSolutionsRet.insert(vSolutionsRet.end(), keys.begin(), keys.end());
        vSolutionsRet.push_back({static_cast<unsigned char>(keys.size())}); // safe as size is in range 1..20
        return TxoutType::MULTISIG;
    }

    vSolutionsRet.clear();
    return TxoutType::NONSTANDARD;
}